

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::Add
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  PropertyId propertyId;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_02;
  undefined1 local_38 [18];
  DictionaryPropertyDescriptor<unsigned_short> local_26;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  unsigned_short index;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  PropertyAttributes attributes_local;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor.Data._0_1_ = usedAsFixed;
  descriptor.Data._1_1_ = isFixed;
  descriptor.Getter._0_1_ = isInitialized;
  descriptor.Getter._1_1_ = attributes;
  unique0x1000039c = (RuntimeFunction *)propertyRecord;
  iVar4 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (0xfffe < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17e,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar1 = this->nextPropertyIndex;
  iVar4 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (iVar4 <= (int)(uint)uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17f,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  descriptor._0_2_ = ::Math::PostInc<unsigned_short>(&this->nextPropertyIndex);
  DictionaryPropertyDescriptor<unsigned_short>::DictionaryPropertyDescriptor
            (&local_26,descriptor._0_2_,descriptor.Getter._1_1_,false,false,false);
  if (((descriptor.Data._1_1_ & 1) != 0) || (((byte)descriptor.Data & 1) != 0)) {
    propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)stack0xffffffffffffffe8);
    BVar5 = IsInternalPropertyId(propertyId);
    if (BVar5 == 0) {
      ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                          ((WriteBarrierPtr *)&this->singletonInstance);
      if (*ppRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) goto LAB_013f2ccf;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x184,
                                "((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr))"
                                ,
                                "(!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
LAB_013f2ccf:
  DictionaryPropertyDescriptor<unsigned_short>::SetIsInitialized
            (&local_26,(bool)((byte)descriptor.Getter & 1));
  DictionaryPropertyDescriptor<unsigned_short>::SetIsFixed
            (&local_26,(bool)(descriptor.Data._1_1_ & 1));
  DictionaryPropertyDescriptor<unsigned_short>::SetUsedAsFixed
            (&local_26,(bool)((byte)descriptor.Data & 1));
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(this_00,(PropertyRecord **)&descriptor.Setter,&local_26);
  ScriptContext::GetLibrary(scriptContext);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
            ((JavascriptLibrary *)(local_38 + 8));
  this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       (local_38 + 8));
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_01,&this->super_DynamicTypeHandler,descriptor.Getter._1_1_,
             (PropertyRecord *)stack0xffffffffffffffe8,scriptContext);
  ScriptContext::GetLibrary(scriptContext);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_38);
  this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                       local_38);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_02,&this->super_DynamicTypeHandler,descriptor.Getter._1_1_,
             (PropertyRecord *)stack0xffffffffffffffe8,scriptContext);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Add(
        const PropertyRecord* propertyRecord,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready
        T index = ::Math::PostInc(nextPropertyIndex);

        DictionaryPropertyDescriptor<T> descriptor(index, attributes);
#if ENABLE_FIXED_FIELDS
        Assert((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr));
        descriptor.SetIsInitialized(isInitialized);
        descriptor.SetIsFixed(isFixed);
        descriptor.SetUsedAsFixed(usedAsFixed);
#endif
        propertyMap->Add(propertyRecord, descriptor);

        scriptContext->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
        scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
    }